

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

void Ses_ManCreateMainClause(Ses_Man_t *pSes,int t,int i,int j,int k,int a,int b,int c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int local_38 [6];
  
  iVar3 = pSes->nGates;
  if (iVar3 <= i) {
    __assert_fail("i < pSes->nGates",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                  ,999,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
  }
  iVar1 = pSes->nSpecVars;
  iVar2 = iVar1 + i;
  if (iVar2 <= k) {
    __assert_fail("k < pSes->nSpecVars + i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                  ,1000,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
  }
  if (k <= j) {
    __assert_fail("j < k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                  ,0x3e9,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
  }
  iVar6 = pSes->nSelectOffset;
  iVar7 = iVar1;
  if (0 < i) {
    do {
      iVar6 = iVar6 + ((iVar7 + -1) * iVar7) / 2;
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar2);
  }
  iVar6 = ~j + k + ((~j + iVar2 * 2) * j) / 2 + iVar6;
  if (-1 < iVar6) {
    local_38[0] = iVar6 * 2 + 1;
    iVar2 = pSes->nRows;
    if (iVar2 <= t) {
      __assert_fail("t < pSes->nRows",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                    ,0x3cb,"int Ses_ManSimVar(Ses_Man_t *, int, int)");
    }
    iVar6 = pSes->nSimOffset;
    iVar7 = iVar2 * i + iVar6 + t;
    if (iVar7 < 0) goto LAB_002c1298;
    local_38[1] = a + iVar7 * 2;
    if (j < iVar1) {
      uVar4 = 2;
      if ((uint)((t + 1U >> (j & 0x1fU) & 1) != 0) != b) {
        return;
      }
    }
    else {
      if (iVar3 <= j - iVar1) goto LAB_002c1333;
      iVar7 = (j - iVar1) * iVar2 + t + iVar6;
      if (iVar7 < 0) goto LAB_002c1298;
      local_38[2] = b + iVar7 * 2;
      uVar4 = 3;
    }
    if (k < iVar1) {
      if ((uint)((t + 1U >> (k & 0x1fU) & 1) != 0) != c) {
        return;
      }
    }
    else {
      if (iVar3 <= k - iVar1) {
LAB_002c1333:
        __assert_fail("i < pSes->nGates",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                      ,0x3ca,"int Ses_ManSimVar(Ses_Man_t *, int, int)");
      }
      iVar6 = iVar2 * (k - iVar1) + t + iVar6;
      if (iVar6 < 0) goto LAB_002c1298;
      uVar5 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
      local_38[uVar5] = c + iVar6 * 2;
    }
    if (0 < b || 0 < c) {
      iVar3 = i * 3 + b * 2 + c + pSes->nGateOffset + -1;
      if (iVar3 < 0) goto LAB_002c1298;
      uVar5 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
      local_38[uVar5] = (iVar3 * 2 - a) + 1;
    }
    sat_solver_addclause(pSes->pSat,local_38,local_38 + uVar4);
    return;
  }
LAB_002c1298:
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12e,"int Abc_Var2Lit(int, int)");
}

Assistant:

static inline void Ses_ManCreateMainClause( Ses_Man_t * pSes, int t, int i, int j, int k, int a, int b, int c )
{
    int pLits[5], ctr = 0;

    pLits[ctr++] = Abc_Var2Lit( Ses_ManSelectVar( pSes, i, j, k ), 1 );
    pLits[ctr++] = Abc_Var2Lit( Ses_ManSimVar( pSes, i, t ), a );

    if ( j < pSes->nSpecVars )
    {
        if ( ( ( ( t + 1 ) & ( 1 << j ) ) ? 1 : 0 ) != b )
            return;
    }
    else
        pLits[ctr++] = Abc_Var2Lit( Ses_ManSimVar( pSes, j - pSes->nSpecVars, t ), b );

    if ( k < pSes->nSpecVars )
    {
        if ( ( ( ( t + 1 ) & ( 1 << k ) ) ? 1 : 0 ) != c )
            return;
    }
    else
        pLits[ctr++] = Abc_Var2Lit( Ses_ManSimVar( pSes, k - pSes->nSpecVars, t ), c );

    if ( b > 0 || c > 0 )
        pLits[ctr++] = Abc_Var2Lit( Ses_ManGateVar( pSes, i, b, c ), 1 - a );

    sat_solver_addclause( pSes->pSat, pLits, pLits + ctr );
}